

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshifter.cpp
# Opt level: O1

void anon_unknown.dwarf_178dea::Fshifter_getParamf(EffectProps *props,ALenum param,float *val)

{
  effect_exception *this;
  
  if (param == 1) {
    *val = (props->Reverb).Density;
    return;
  }
  this = (effect_exception *)__cxa_allocate_exception(0x30);
  effect_exception::effect_exception
            (this,0xa002,"Invalid frequency shifter float property 0x%04x",(ulong)(uint)param);
  __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void Fshifter_getParamf(const EffectProps *props, ALenum param, float *val)
{
    switch(param)
    {
    case AL_FREQUENCY_SHIFTER_FREQUENCY:
        *val = props->Fshifter.Frequency;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid frequency shifter float property 0x%04x",
            param};
    }
}